

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

OptionParser * option_parser_new(Option *options,size_t num_options,int argc,char **argv)

{
  OptionParser *pOVar1;
  
  pOVar1 = (OptionParser *)calloc(1,0x28);
  pOVar1->options = options;
  pOVar1->num_options = num_options;
  pOVar1->argc = argc;
  pOVar1->argv = argv;
  pOVar1->arg_index = 1;
  return pOVar1;
}

Assistant:

OptionParser* option_parser_new(const Option* options, size_t num_options,
                                int argc, char** argv) {
  OptionParser* parser = xcalloc(1, sizeof(OptionParser));
  parser->options = options;
  parser->num_options = num_options;
  parser->argc = argc;
  parser->argv = argv;
  parser->arg_index = 1; /* Skip the program name (arg 0). */
  return parser;
}